

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

iterator __thiscall
cppcms::impl::details::basic_map<$7159f324$>::allocate(basic_map<_7159f324_> *this,value_type *v)

{
  container *pcVar1;
  iterator p;
  container_alloc al;
  value_type *in_stack_ffffffffffffffb8;
  container *this_00;
  size_type in_stack_ffffffffffffffc8;
  new_allocator<_b487a5d2_> *in_stack_ffffffffffffffd0;
  
  this_00 = (container *)&stack0xffffffffffffffef;
  std::allocator<$b487a5d2$>::allocator((allocator<_b487a5d2_> *)0x41da8d);
  pcVar1 = __gnu_cxx::new_allocator<$b487a5d2$>::allocate
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,this_00);
  container::container(this_00,in_stack_ffffffffffffffb8);
  std::allocator<$b487a5d2$>::~allocator((allocator<_b487a5d2_> *)0x41db31);
  return pcVar1;
}

Assistant:

iterator allocate(value_type const &v)
	{
		container_alloc al;
		iterator p = al.allocate(1);
		try {
			new (p) container(v);
		}
		catch(...) {
			al.deallocate(p,1);
			throw;
		}
		return p;
	}